

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall
spectest::CommandRunner::OnActionCommand(CommandRunner *this,ActionCommand *command)

{
  uint32_t line_number;
  undefined8 local_90 [4];
  ActionResult result;
  
  RunAction(&result,this,(command->super_CommandMixin<(wabt::CommandType)2>).super_Command.line,
            &command->action,Verbose);
  if (result.trap.obj_ != (Trap *)0x0) {
    line_number = (command->super_CommandMixin<(wabt::CommandType)2>).super_Command.line;
    std::__cxx11::string::string((string *)local_90,(string *)&(result.trap.obj_)->message_);
    PrintError(this,line_number,"unexpected trap: %s",local_90[0]);
    std::__cxx11::string::_M_dispose();
  }
  ActionResult::~ActionResult(&result);
  return (Result)(uint)(result.trap.obj_ != (Trap *)0x0);
}

Assistant:

wabt::Result CommandRunner::OnActionCommand(const ActionCommand* command) {
  ActionResult result =
      RunAction(command->line, &command->action, RunVerbosity::Verbose);

  if (result.trap) {
    PrintError(command->line, "unexpected trap: %s",
               result.trap->message().c_str());
    return wabt::Result::Error;
  }

  return wabt::Result::Ok;
}